

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

bool __thiscall tf::Node::_acquire_all(Node *this,SmallVector<tf::Node_*,_2U> *nodes)

{
  bool bVar1;
  Node *me;
  SmallVectorTemplateCommon<tf::Semaphore_*,_void> *pSVar2;
  Semaphore *in_RSI;
  SmallVector<tf::Node_*,_2U> *in_stack_00000008;
  Semaphore *in_stack_00000010;
  size_t j;
  size_t i;
  SmallVector<tf::Semaphore_*,_2U> *to_acquire;
  size_type in_stack_ffffffffffffffb8;
  SmallVectorTemplateCommon<tf::Semaphore_*,_void> *this_00;
  SmallVectorTemplateCommon<tf::Semaphore_*,_void> *local_30;
  SmallVectorTemplateCommon<tf::Semaphore_*,_void> *local_28;
  
  me = (Node *)std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
               operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                           *)0x10c654);
  local_28 = (SmallVectorTemplateCommon<tf::Semaphore_*,_void> *)0x0;
  while( true ) {
    this_00 = local_28;
    pSVar2 = (SmallVectorTemplateCommon<tf::Semaphore_*,_void> *)
             SmallVectorTemplateCommon<tf::Semaphore_*,_void>::size(local_28);
    if (pSVar2 <= this_00) {
      return true;
    }
    SmallVectorTemplateCommon<tf::Semaphore_*,_void>::operator[](this_00,in_stack_ffffffffffffffb8);
    bVar1 = Semaphore::_try_acquire_or_wait(in_RSI,me);
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  for (local_30 = (SmallVectorTemplateCommon<tf::Semaphore_*,_void> *)0x1; local_30 <= local_28;
      local_30 = local_30 + 1) {
    SmallVectorTemplateCommon<tf::Semaphore_*,_void>::operator[](this_00,in_stack_ffffffffffffffb8);
    Semaphore::_release(in_stack_00000010,in_stack_00000008);
  }
  return false;
}

Assistant:

inline bool Node::_acquire_all(SmallVector<Node*>& nodes) {
  // assert(_semaphores != nullptr);
  auto& to_acquire = _semaphores->to_acquire;
  for(size_t i = 0; i < to_acquire.size(); ++i) {
    if(!to_acquire[i]->_try_acquire_or_wait(this)) {
      for(size_t j = 1; j <= i; ++j) {
        to_acquire[i-j]->_release(nodes);
      }
      return false;
    }
  }
  return true;
}